

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O2

InstanceBuilder * __thiscall
vkb::InstanceBuilder::add_validation_feature_enable
          (InstanceBuilder *this,VkValidationFeatureEnableEXT enable)

{
  VkValidationFeatureEnableEXT local_c;
  
  local_c = enable;
  std::vector<VkValidationFeatureEnableEXT,_std::allocator<VkValidationFeatureEnableEXT>_>::
  push_back(&(this->info).enabled_validation_features,&local_c);
  return this;
}

Assistant:

InstanceBuilder& InstanceBuilder::add_validation_feature_enable(VkValidationFeatureEnableEXT enable) {
    info.enabled_validation_features.push_back(enable);
    return *this;
}